

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

idx_t duckdb::GetValidMinMaxSubstring(const_data_ptr_t data)

{
  idx_t i;
  
  for (i = 0; (i != 8 && ('\0' < (char)data[i])); i = i + 1) {
  }
  return i;
}

Assistant:

static idx_t GetValidMinMaxSubstring(const_data_ptr_t data) {
	for (idx_t i = 0; i < StringStatsData::MAX_STRING_MINMAX_SIZE; i++) {
		if (data[i] == '\0') {
			return i;
		}
		if ((data[i] & 0x80) != 0) {
			return i;
		}
	}
	return StringStatsData::MAX_STRING_MINMAX_SIZE;
}